

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

bool __thiscall
helics::ValueFederateManager::getUpdateFromCore(ValueFederateManager *this,Input *inp)

{
  void *pvVar1;
  _func_int **pp_Var2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SmallBuffer *__tmp;
  
  pvVar1 = inp->dataReference;
  pp_Var2 = this->coreObject->_vptr_Core;
  if (inp->inputVectorOp != NO_OP) {
    iVar7 = (*pp_Var2[0x33])();
    *(undefined1 *)((long)pvVar1 + 0xe0) = 0;
    bVar6 = Input::vectorDataProcess
                      (inp,(vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                            *)CONCAT44(extraout_var,iVar7));
    return bVar6;
  }
  iVar7 = (*pp_Var2[0x32])(this->coreObject,(ulong)(uint)(inp->super_Interface).handle.hid,0);
  lVar3 = *(long *)CONCAT44(extraout_var_00,iVar7);
  lVar4 = ((long *)CONCAT44(extraout_var_00,iVar7))[1];
  if (lVar4 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
    }
  }
  uVar5 = *(undefined8 *)(lVar3 + 0x50);
  *(undefined8 *)((long)pvVar1 + 8) = *(undefined8 *)(lVar3 + 0x40);
  *(undefined8 *)((long)pvVar1 + 0x10) = uVar5;
  *(long *)((long)pvVar1 + 0x18) = lVar3;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar1 + 0x20);
  *(long *)((long)pvVar1 + 0x20) = lVar4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  *(undefined1 *)((long)pvVar1 + 0xe0) = 1;
  bVar6 = Input::checkUpdate(inp,true);
  return bVar6;
}

Assistant:

bool ValueFederateManager::getUpdateFromCore(Input& inp)
{
    auto* iData = static_cast<InputData*>(inp.dataReference);
    if (inp.getMultiInputMode() != MultiInputHandlingMethod::NO_OP) {
        const auto& dataV = coreObject->getAllValues(inp.handle);
        iData->hasUpdate = false;
        return inp.vectorDataProcess(dataV);
    }
    const auto& data = coreObject->getValue(inp.handle);
    iData->lastData = data;
    iData->hasUpdate = true;
    return inp.checkUpdate(true);
}